

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackTraceGnu-inl.cpp
# Opt level: O2

BackTraceSymbol __thiscall
cppassert::internal::BackTraceSymbol::createFromBacktraceStr
          (BackTraceSymbol *this,char *backTraceSymbol,CppDemangler *demangler)

{
  char *pcVar1;
  char *extraout_RDX;
  char *extraout_RDX_00;
  BackTraceSymbol BVar2;
  char *beginOffset;
  char *beginName;
  char *endOffset;
  char *local_48;
  char *local_40;
  char *local_38;
  
  this->symbol_ = "<unkown>";
  this->allocated_ = (char *)0x0;
  local_40 = (char *)0x0;
  local_48 = (char *)0x0;
  local_38 = (char *)0x0;
  findSymbolInBacktraceStr(backTraceSymbol,&local_40,&local_48,&local_38);
  if ((local_40 < local_48 && local_38 != (char *)0x0) &&
      (local_48 != (char *)0x0 && local_40 != (char *)0x0)) {
    pcVar1 = local_40 + 1;
    *local_40 = '\0';
    *local_48 = '\0';
    local_48 = local_48 + 1;
    local_40 = pcVar1;
    pcVar1 = CppDemangler::demangle(demangler,pcVar1);
    if (pcVar1 != (char *)0x0) {
      setSymbol(this,backTraceSymbol,pcVar1,local_48);
      pcVar1 = extraout_RDX;
      goto LAB_00120102;
    }
    local_48 = local_48 + -1;
    local_40[-1] = '(';
    *local_48 = '+';
    local_40 = local_40 + -1;
  }
  deallocate(this);
  this->symbol_ = backTraceSymbol;
  pcVar1 = extraout_RDX_00;
LAB_00120102:
  BVar2.allocated_ = pcVar1;
  BVar2.symbol_ = (char *)this;
  return BVar2;
}

Assistant:

static BackTraceSymbol createFromBacktraceStr(char *backTraceSymbol
                                        , CppDemangler *demangler)
    {
        BackTraceSymbol result;
        char *beginName = 0, *beginOffset = 0, *endOffset = 0;
        findSymbolInBacktraceStr(backTraceSymbol
                                , &beginName
                                , &beginOffset
                                , &endOffset);

        if (beginName
            && beginOffset
            && endOffset
	    && beginName < beginOffset)
	{
	    *beginName++ = '\0';
            *beginOffset++ = '\0';
            const char *demangledSymbol = demangler->demangle(beginName);
            if(demangledSymbol)
            {
                result.setSymbol(backTraceSymbol, demangledSymbol, beginOffset);
            }
            else
            {
                //restore previous state
                --beginName;
                --beginOffset;
                *beginName = '(';
                *beginOffset = '+';
                result.setSymbol(backTraceSymbol);
            }
        }
        else
        {
            result.setSymbol(backTraceSymbol);
        }

        return result;
    }